

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O2

int ecx_readODdescription(ecx_contextt *context,uint16 Item,ec_ODlistt *pODlist)

{
  uint8 uVar1;
  int iVar2;
  ushort uVar3;
  undefined6 in_register_00000032;
  ulong uVar4;
  ec_mbxbuft MbxIn;
  ec_mbxbuft MbxOut;
  
  uVar3 = pODlist->Slave;
  uVar4 = CONCAT62(in_register_00000032,Item) & 0xffffffff;
  pODlist->DataType[uVar4] = 0;
  pODlist->ObjectCode[uVar4] = '\0';
  pODlist->MaxSub[uVar4] = '\0';
  pODlist->Name[uVar4][0] = '\0';
  ec_clearmbx(&MbxIn);
  ecx_mbxreceive(context,uVar3,&MbxIn,0);
  ec_clearmbx(&MbxOut);
  MbxOut[0] = '\b';
  MbxOut[1] = '\0';
  MbxOut[2] = '\0';
  MbxOut[3] = '\0';
  MbxOut[4] = '\0';
  uVar1 = ec_nextmbxcnt(context->slavelist[uVar3].mbx_cnt);
  context->slavelist[uVar3].mbx_cnt = uVar1;
  MbxOut[5] = uVar1 << 4 | 3;
  MbxOut[6] = '\0';
  MbxOut[7] = 0x80;
  MbxOut[8] = '\x03';
  MbxOut[9] = '\0';
  MbxOut[10] = '\0';
  MbxOut[0xb] = '\0';
  MbxOut._12_2_ = pODlist->Index[uVar4];
  iVar2 = ecx_mbxsend(context,uVar3,&MbxOut,20000);
  if (0 < iVar2) {
    ec_clearmbx(&MbxIn);
    iVar2 = ecx_mbxreceive(context,uVar3,&MbxIn,700000);
    if (0 < iVar2) {
      if ((MbxIn[8] & 0x7f) == 4 && (MbxIn[5] & 0xf) == 3) {
        uVar3 = 0x28;
        if ((ushort)(MbxIn._0_2_ - 0xc) < 0x28) {
          uVar3 = MbxIn._0_2_ - 0xc;
        }
        pODlist->DataType[uVar4] = MbxIn._14_2_;
        pODlist->ObjectCode[uVar4] = MbxIn[0x11];
        pODlist->MaxSub[uVar4] = MbxIn[0x10];
        strncpy(pODlist->Name[uVar4],(char *)(MbxIn + 0x12),(ulong)uVar3);
        pODlist->Name[uVar4][uVar3] = '\0';
      }
      else if ((MbxIn[8] & 0x7f) == 7) {
        iVar2 = 0;
        ecx_SDOinfoerror(context,uVar3,pODlist->Index[uVar4],'\0',MbxIn._12_4_);
      }
      else {
        iVar2 = 0;
        ecx_packeterror(context,uVar3,pODlist->Index[uVar4],'\0',1);
      }
    }
  }
  return iVar2;
}

Assistant:

int ecx_readODdescription(ecx_contextt *context, uint16 Item, ec_ODlistt *pODlist)
{
   ec_SDOservicet *SDOp, *aSDOp;
   int wkc;
   uint16  n, Slave;
   ec_mbxbuft MbxIn, MbxOut;
   uint8 cnt;

   Slave = pODlist->Slave;
   pODlist->DataType[Item] = 0;
   pODlist->ObjectCode[Item] = 0;
   pODlist->MaxSub[Item] = 0;
   pODlist->Name[Item][0] = 0;
   ec_clearmbx(&MbxIn);
   /* clear pending out mailbox in slave if available. Timeout is set to 0 */
   wkc = ecx_mbxreceive(context, Slave, &MbxIn, 0);
   ec_clearmbx(&MbxOut);
   aSDOp = (ec_SDOservicet*)&MbxIn;
   SDOp = (ec_SDOservicet*)&MbxOut;
   SDOp->MbxHeader.length = htoes(0x0008);
   SDOp->MbxHeader.address = htoes(0x0000);
   SDOp->MbxHeader.priority = 0x00;
   /* Get new mailbox counter value */
   cnt = ec_nextmbxcnt(context->slavelist[Slave].mbx_cnt);
   context->slavelist[Slave].mbx_cnt = cnt;
   SDOp->MbxHeader.mbxtype = ECT_MBXT_COE + (cnt << 4); /* CoE */
   SDOp->CANOpen = htoes(0x000 + (ECT_COES_SDOINFO << 12)); /* number 9bits service upper 4 bits */
   SDOp->Opcode = ECT_GET_OD_REQ; /* get object description request */
   SDOp->Reserved = 0;
   SDOp->Fragments = 0; /* fragments left */
   SDOp->wdata[0] = htoes(pODlist->Index[Item]); /* Data of Index */
   /* send get object description request to slave */
   wkc = ecx_mbxsend(context, Slave, &MbxOut, EC_TIMEOUTTXM);
   /* mailbox placed in slave ? */
   if (wkc > 0)
   {
      ec_clearmbx(&MbxIn);
      /* read slave response */
      wkc = ecx_mbxreceive(context, Slave, &MbxIn, EC_TIMEOUTRXM);
      /* got response ? */
      if (wkc > 0)
      {
         if (((aSDOp->MbxHeader.mbxtype & 0x0f) == ECT_MBXT_COE) &&
             ((aSDOp->Opcode & 0x7f) == ECT_GET_OD_RES))
         {
            n = (etohs(aSDOp->MbxHeader.length) - 12); /* length of string(name of object) */
            if (n > EC_MAXNAME)
            {
               n = EC_MAXNAME; /* max chars */
            }
            pODlist->DataType[Item] = etohs(aSDOp->wdata[1]);
            pODlist->ObjectCode[Item] = aSDOp->bdata[5];
            pODlist->MaxSub[Item] = aSDOp->bdata[4];

            strncpy(pODlist->Name[Item] , (char *)&aSDOp->bdata[6], n);
            pODlist->Name[Item][n] = 0x00; /* String terminator */
         }
         /* got unexpected response from slave */
         else
         {
            if (((aSDOp->Opcode & 0x7f) == ECT_SDOINFO_ERROR)) /* SDO info error received */
            {
               ecx_SDOinfoerror(context, Slave,pODlist->Index[Item], 0, etohl(aSDOp->ldata[0]));
            }
            else
            {
               ecx_packeterror(context, Slave,pODlist->Index[Item], 0, 1); /* Unexpected frame returned */
            }
            wkc = 0;
         }
      }
   }
  
   return wkc;
}